

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BS_thread_pool.hpp
# Opt level: O1

void __thiscall
BS::thread_pool<(unsigned_char)'\x00'>::~thread_pool(thread_pool<(unsigned_char)__x00_> *this)

{
  jthread *__ptr;
  _Manager_type p_Var1;
  void *in_RSI;
  
  wait(this,in_RSI);
  __ptr = (this->threads)._M_t.
          super___uniq_ptr_impl<std::jthread,_std::default_delete<std::jthread[]>_>._M_t.
          super__Tuple_impl<0UL,_std::jthread_*,_std::default_delete<std::jthread[]>_>.
          super__Head_base<0UL,_std::jthread_*,_false>._M_head_impl;
  if (__ptr != (jthread *)0x0) {
    std::default_delete<std::jthread[]>::operator()
              ((default_delete<std::jthread[]> *)&this->threads,__ptr);
  }
  (this->threads)._M_t.super___uniq_ptr_impl<std::jthread,_std::default_delete<std::jthread[]>_>.
  _M_t.super__Tuple_impl<0UL,_std::jthread_*,_std::default_delete<std::jthread[]>_>.
  super__Head_base<0UL,_std::jthread_*,_false>._M_head_impl = (jthread *)0x0;
  std::deque<std::function<void_()>,_std::allocator<std::function<void_()>_>_>::~deque
            (&(this->tasks).c);
  std::condition_variable::~condition_variable(&this->tasks_done_cv);
  std::_V2::condition_variable_any::~condition_variable_any(&this->task_available_cv);
  p_Var1 = (this->init_func).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)&this->init_func,(_Any_data *)&this->init_func,__destroy_functor);
  }
  p_Var1 = (this->cleanup_func).super__Function_base._M_manager;
  if (p_Var1 != (_Manager_type)0x0) {
    (*p_Var1)((_Any_data *)this,(_Any_data *)this,__destroy_functor);
  }
  return;
}

Assistant:

~thread_pool() noexcept
    {
#ifdef __cpp_exceptions
        try
        {
#endif
            wait();
#ifndef __cpp_lib_jthread
            destroy_threads();
#endif
#ifdef __cpp_exceptions
        }
        catch (...)
        {
        }
#endif
    }